

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PlatformIsAppleSimulator(cmMakefile *this)

{
  initializer_list<cmMakefile::AppleSDK> __l;
  size_type sVar1;
  AppleSDK local_78 [5];
  allocator<cmMakefile::AppleSDK> local_62;
  less<cmMakefile::AppleSDK> local_61;
  AppleSDK local_60 [4];
  iterator local_50;
  size_type local_48;
  set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  local_40;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_60[0] = AppleTVSimulator;
  local_60[1] = 2;
  local_60[2] = 6;
  local_60[3] = 8;
  local_50 = local_60;
  local_48 = 4;
  local_10 = this;
  std::allocator<cmMakefile::AppleSDK>::allocator(&local_62);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::
  set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  ::set(&local_40,__l,&local_61,&local_62);
  local_78[0] = GetAppleSDKType(this);
  sVar1 = std::
          set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
          ::count(&local_40,local_78);
  std::
  set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  ::~set(&local_40);
  std::allocator<cmMakefile::AppleSDK>::~allocator(&local_62);
  return sVar1 != 0;
}

Assistant:

bool cmMakefile::PlatformIsAppleSimulator() const
{
  return std::set<AppleSDK>{
    AppleSDK::AppleTVSimulator,
    AppleSDK::IPhoneSimulator,
    AppleSDK::WatchSimulator,
    AppleSDK::XRSimulator,
  }
    .count(this->GetAppleSDKType());
}